

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnAssertMalformedCommand
          (CommandRunner *this,AssertMalformedCommand *command)

{
  Result RVar1;
  string_view module_filename;
  
  module_filename._M_str = (command->filename)._M_dataplus._M_p;
  module_filename._M_len = (command->filename)._M_string_length;
  RVar1 = ReadInvalidModule(this,(command->super_CommandMixin<(wabt::CommandType)4>).super_Command.
                                 line,module_filename,command->type,"assert_malformed");
  if (RVar1.enum_ == Ok) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)4>).super_Command.line,
               "expected module to be malformed: \"%s\"",(command->filename)._M_dataplus._M_p);
  }
  return (Result)(uint)(RVar1.enum_ == Ok);
}

Assistant:

wabt::Result CommandRunner::OnAssertMalformedCommand(
    const AssertMalformedCommand* command) {
  wabt::Result result = ReadInvalidModule(command->line, command->filename,
                                          command->type, "assert_malformed");
  if (Succeeded(result)) {
    PrintError(command->line, "expected module to be malformed: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}